

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

UBool __thiscall icu_63::NFRule::operator==(NFRule *this,NFRule *rhs)

{
  UBool UVar1;
  bool local_19;
  NFRule *rhs_local;
  NFRule *this_local;
  
  local_19 = false;
  if (((this->baseValue == rhs->baseValue) && (local_19 = false, this->radix == rhs->radix)) &&
     (local_19 = false, this->exponent == rhs->exponent)) {
    UVar1 = UnicodeString::operator==(&this->fRuleText,&rhs->fRuleText);
    local_19 = false;
    if (UVar1 != '\0') {
      UVar1 = util_equalSubstitutions(this->sub1,rhs->sub1);
      local_19 = false;
      if (UVar1 != '\0') {
        UVar1 = util_equalSubstitutions(this->sub2,rhs->sub2);
        local_19 = UVar1 != '\0';
      }
    }
  }
  return local_19;
}

Assistant:

UBool
NFRule::operator==(const NFRule& rhs) const
{
    return baseValue == rhs.baseValue
        && radix == rhs.radix
        && exponent == rhs.exponent
        && fRuleText == rhs.fRuleText
        && util_equalSubstitutions(sub1, rhs.sub1)
        && util_equalSubstitutions(sub2, rhs.sub2);
}